

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,NamedMDNode *md)

{
  uint uVar1;
  String *ts;
  MDNode *md_00;
  uint local_1c;
  uint i;
  NamedMDNode *md_local;
  StreamState *this_local;
  
  ts = NamedMDNode::getName_abi_cxx11_(md);
  append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[6]>
            (this,(char (*) [2])0x2a90e5,ts,(char (*) [6])" = !{");
  local_1c = 0;
  while( true ) {
    uVar1 = NamedMDNode::getNumOperands(md);
    if (uVar1 <= local_1c) break;
    md_00 = NamedMDNode::getOperand(md,local_1c);
    append(this,md_00,false);
    uVar1 = NamedMDNode::getNumOperands(md);
    if (local_1c + 1 < uVar1) {
      append(this,", ");
    }
    local_1c = local_1c + 1;
  }
  append(this,"}");
  return;
}

Assistant:

void StreamState::append(NamedMDNode *md)
{
	append("!", md->getName(), " = !{");
	for (unsigned i = 0; i < md->getNumOperands(); i++)
	{
		append(md->getOperand(i), false);
		if (i + 1 < md->getNumOperands())
			append(", ");
	}

	append("}");
}